

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O0

Exception * __thiscall avro::json::JsonParser::unexpected(JsonParser *this,uchar c)

{
  char cVar1;
  ostream *poVar2;
  byte in_DL;
  Exception *in_RDI;
  ostringstream oss;
  undefined7 in_stack_fffffffffffffe08;
  string local_1c0 [48];
  ostringstream local_190 [383];
  byte local_11;
  
  local_11 = in_DL;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"Unexpected character in json ");
  cVar1 = toHex((uint)(local_11 >> 4));
  poVar2 = std::operator<<(poVar2,cVar1);
  cVar1 = toHex(local_11 & 0xf);
  std::operator<<(poVar2,cVar1);
  std::__cxx11::ostringstream::str();
  Exception::Exception((Exception *)poVar2,(string *)CONCAT17(cVar1,in_stack_fffffffffffffe08));
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

Exception JsonParser::unexpected(unsigned char c)
{
    std::ostringstream oss;
    oss << "Unexpected character in json " << toHex(c / 16) << toHex(c % 16);
    return Exception(oss.str());
}